

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrsbit.c
# Opt level: O3

FT_Error pfr_load_bitmap_metrics
                   (FT_Byte **pdata,FT_Byte *limit,FT_Long scaled_advance,FT_Long *axpos,
                   FT_Long *aypos,FT_UInt *axsize,FT_UInt *aysize,FT_Long *aadvance,FT_UInt *aformat
                   )

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  FT_UInt FVar4;
  uint uVar5;
  FT_UInt FVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  ushort *puVar15;
  ushort *puVar16;
  FT_UInt FVar17;
  ulong local_40;
  
  pbVar3 = *pdata;
  if (limit < pbVar3 + 1) {
    return 8;
  }
  bVar1 = *pbVar3;
  switch(bVar1 & 3) {
  case 0:
    puVar15 = (ushort *)(pbVar3 + 2);
    if (limit < puVar15) {
      return 8;
    }
    bVar14 = pbVar3[1];
    local_40 = (ulong)((char)bVar14 >> 4);
    uVar11 = (long)((ulong)bVar14 << 0x3c) >> 0x3c;
    bVar14 = bVar1 >> 2 & 3;
    FVar17 = (FT_UInt)bVar14;
    puVar16 = puVar15;
    uVar9 = FVar17;
    switch(bVar14) {
    case 1:
switchD_00205adf_caseD_1:
      puVar16 = (ushort *)((long)puVar15 + 1);
      if (limit < puVar16) {
        return 8;
      }
      bVar14 = (byte)*puVar15 >> 4;
      FVar17 = (FT_UInt)bVar14;
      uVar9 = (byte)*puVar15 & 0xf;
      bVar1 = bVar1 >> 4;
      uVar12 = (uint)bVar1;
      uVar13 = (uint)bVar1;
      puVar15 = puVar16;
      FVar4 = (uint)bVar14;
      uVar5 = uVar9;
      FVar6 = (uint)bVar14;
      uVar7 = uVar9;
      switch(bVar1 & 3) {
      case 0:
        goto switchD_00205bdd_caseD_0;
      case 1:
        goto switchD_00205bdd_caseD_1;
      case 3:
        goto switchD_00205bdd_caseD_3;
      }
      goto switchD_00205bdd_caseD_2;
    case 2:
switchD_00205adf_caseD_2:
      puVar16 = puVar15 + 1;
      if (limit < puVar16) {
        return 8;
      }
      bVar14 = (byte)*puVar15;
      FVar17 = (FT_UInt)bVar14;
      bVar2 = *(byte *)((long)puVar15 + 1);
      uVar9 = (uint)bVar2;
      bVar1 = bVar1 >> 4;
      uVar12 = (uint)bVar1;
      uVar13 = (uint)bVar1;
      puVar15 = puVar16;
      FVar4 = (uint)bVar14;
      uVar5 = (uint)bVar2;
      FVar6 = (uint)bVar14;
      uVar7 = (uint)bVar2;
      switch(bVar1 & 3) {
      case 0:
        goto switchD_00205bdd_caseD_0;
      case 2:
        goto switchD_00205bdd_caseD_2;
      case 3:
        goto switchD_00205bdd_caseD_3;
      }
      goto switchD_00205bdd_caseD_1;
    case 3:
switchD_00205adf_caseD_3:
      puVar16 = puVar15 + 2;
      if (limit < puVar16) {
        return 8;
      }
      FVar17 = (FT_UInt)(ushort)(*puVar15 << 8 | *puVar15 >> 8);
      uVar9 = (uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8);
    }
    break;
  case 1:
    puVar15 = (ushort *)(pbVar3 + 3);
    if (limit < puVar15) {
      return 8;
    }
    local_40 = (ulong)(char)pbVar3[1];
    uVar11 = (ulong)(char)pbVar3[2];
    bVar14 = bVar1 >> 2 & 3;
    FVar17 = (FT_UInt)bVar14;
    puVar16 = puVar15;
    uVar9 = FVar17;
    switch(bVar14) {
    case 1:
      goto switchD_00205adf_caseD_1;
    case 2:
      goto switchD_00205adf_caseD_2;
    case 3:
      goto switchD_00205adf_caseD_3;
    }
    break;
  case 2:
    puVar15 = (ushort *)(pbVar3 + 5);
    if (limit < puVar15) {
      return 8;
    }
    local_40 = (long)(short)((ushort)pbVar3[1] << 8) | (ulong)pbVar3[2];
    uVar11 = (long)(short)((ushort)pbVar3[3] << 8) | (ulong)pbVar3[4];
    bVar14 = bVar1 >> 2 & 3;
    FVar17 = (FT_UInt)bVar14;
    puVar16 = puVar15;
    uVar9 = FVar17;
    switch(bVar14) {
    case 1:
      goto switchD_00205adf_caseD_1;
    case 2:
      goto switchD_00205adf_caseD_2;
    case 3:
      goto switchD_00205adf_caseD_3;
    }
    break;
  case 3:
    puVar15 = (ushort *)(pbVar3 + 7);
    if (limit < puVar15) {
      return 8;
    }
    local_40 = (ulong)pbVar3[3] | (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[1] << 0x10);
    uVar11 = (ulong)pbVar3[6] | (ulong)((uint)pbVar3[5] << 8 | (uint)pbVar3[4] << 0x10);
    bVar14 = bVar1 >> 2 & 3;
    FVar17 = (FT_UInt)bVar14;
    puVar16 = puVar15;
    uVar9 = FVar17;
    switch(bVar14) {
    case 1:
      goto switchD_00205adf_caseD_1;
    case 2:
      goto switchD_00205adf_caseD_2;
    case 3:
      goto switchD_00205adf_caseD_3;
    }
  }
  bVar1 = bVar1 >> 4;
  uVar12 = (uint)bVar1;
  uVar13 = (uint)bVar1;
  puVar15 = puVar16;
  FVar4 = FVar17;
  uVar5 = uVar9;
  FVar6 = FVar17;
  uVar7 = uVar9;
  switch(bVar1 & 3) {
  case 0:
    goto switchD_00205bdd_caseD_0;
  case 1:
switchD_00205bdd_caseD_1:
    uVar9 = uVar5;
    FVar17 = FVar4;
    uVar13 = uVar12;
    puVar16 = (ushort *)((long)puVar15 + 1);
    if (limit < puVar16) {
      return 8;
    }
    scaled_advance = (long)(char)(byte)*puVar15 << 8;
    goto switchD_00205bdd_caseD_0;
  case 2:
switchD_00205bdd_caseD_2:
    uVar9 = uVar7;
    FVar17 = FVar6;
    uVar13 = uVar12;
    puVar16 = puVar15 + 1;
    if (limit < puVar16) {
      return 8;
    }
    uVar10 = (ulong)*(byte *)((long)puVar15 + 1);
    uVar8 = (ulong)(short)((ushort)(byte)*puVar15 << 8);
    break;
  case 3:
switchD_00205bdd_caseD_3:
    uVar9 = uVar7;
    FVar17 = FVar6;
    uVar13 = uVar12;
    puVar16 = (ushort *)((long)puVar15 + 3);
    if (limit < puVar16) {
      return 8;
    }
    uVar10 = (ulong)((uint)*(byte *)((long)puVar15 + 1) << 8 | (uint)(byte)*puVar15 << 0x10);
    uVar8 = (ulong)(byte)puVar15[1];
  }
  scaled_advance = uVar8 | uVar10;
switchD_00205bdd_caseD_0:
  *axpos = local_40;
  *aypos = uVar11;
  *axsize = FVar17;
  *aysize = uVar9;
  *aadvance = scaled_advance;
  *aformat = uVar13 >> 2;
  *pdata = (FT_Byte *)puVar16;
  return 0;
}

Assistant:

static FT_Error
  pfr_load_bitmap_metrics( FT_Byte**  pdata,
                           FT_Byte*   limit,
                           FT_Long    scaled_advance,
                           FT_Long   *axpos,
                           FT_Long   *aypos,
                           FT_UInt   *axsize,
                           FT_UInt   *aysize,
                           FT_Long   *aadvance,
                           FT_UInt   *aformat )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte   flags;
    FT_Byte   b;
    FT_Byte*  p = *pdata;
    FT_Long   xpos, ypos, advance;
    FT_UInt   xsize, ysize;


    PFR_CHECK( 1 );
    flags = PFR_NEXT_BYTE( p );

    xpos    = 0;
    ypos    = 0;
    xsize   = 0;
    ysize   = 0;
    advance = 0;

    switch ( flags & 3 )
    {
    case 0:
      PFR_CHECK( 1 );
      b    = PFR_NEXT_BYTE( p );
      xpos = (FT_Char)b >> 4;
      ypos = ( (FT_Char)( b << 4 ) ) >> 4;
      break;

    case 1:
      PFR_CHECK( 2 );
      xpos = PFR_NEXT_INT8( p );
      ypos = PFR_NEXT_INT8( p );
      break;

    case 2:
      PFR_CHECK( 4 );
      xpos = PFR_NEXT_SHORT( p );
      ypos = PFR_NEXT_SHORT( p );
      break;

    case 3:
      PFR_CHECK( 6 );
      xpos = PFR_NEXT_LONG( p );
      ypos = PFR_NEXT_LONG( p );
      break;

    default:
      ;
    }

    flags >>= 2;
    switch ( flags & 3 )
    {
    case 0:
      /* blank image */
      xsize = 0;
      ysize = 0;
      break;

    case 1:
      PFR_CHECK( 1 );
      b     = PFR_NEXT_BYTE( p );
      xsize = ( b >> 4 ) & 0xF;
      ysize = b & 0xF;
      break;

    case 2:
      PFR_CHECK( 2 );
      xsize = PFR_NEXT_BYTE( p );
      ysize = PFR_NEXT_BYTE( p );
      break;

    case 3:
      PFR_CHECK( 4 );
      xsize = PFR_NEXT_USHORT( p );
      ysize = PFR_NEXT_USHORT( p );
      break;

    default:
      ;
    }

    flags >>= 2;
    switch ( flags & 3 )
    {
    case 0:
      advance = scaled_advance;
      break;

    case 1:
      PFR_CHECK( 1 );
      advance = PFR_NEXT_INT8( p ) * 256;
      break;

    case 2:
      PFR_CHECK( 2 );
      advance = PFR_NEXT_SHORT( p );
      break;

    case 3:
      PFR_CHECK( 3 );
      advance = PFR_NEXT_LONG( p );
      break;

    default:
      ;
    }

    *axpos    = xpos;
    *aypos    = ypos;
    *axsize   = xsize;
    *aysize   = ysize;
    *aadvance = advance;
    *aformat  = flags >> 2;
    *pdata    = p;

  Exit:
    return error;

  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_load_bitmap_metrics: invalid glyph data\n" ));
    goto Exit;
  }